

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.cpp
# Opt level: O2

char * xe::getTestStatusCodeName(TestStatusCode code)

{
  if (code < TESTSTATUSCODE_LAST) {
    return &DAT_001152d4 + *(int *)(&DAT_001152d4 + (ulong)code * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* getTestStatusCodeName (TestStatusCode code)
{
	switch (code)
	{
		case TESTSTATUSCODE_PASS:					return "Pass";
		case TESTSTATUSCODE_FAIL:					return "Fail";
		case TESTSTATUSCODE_QUALITY_WARNING:		return "QualityWarning";
		case TESTSTATUSCODE_COMPATIBILITY_WARNING:	return "CompatibilityWarning";
		case TESTSTATUSCODE_PENDING:				return "Pending";
		case TESTSTATUSCODE_RUNNING:				return "Running";
		case TESTSTATUSCODE_NOT_SUPPORTED:			return "NotSupported";
		case TESTSTATUSCODE_RESOURCE_ERROR:			return "ResourceError";
		case TESTSTATUSCODE_INTERNAL_ERROR:			return "InternalError";
		case TESTSTATUSCODE_CANCELED:				return "Canceled";
		case TESTSTATUSCODE_TIMEOUT:				return "Timeout";
		case TESTSTATUSCODE_CRASH:					return "Crash";
		case TESTSTATUSCODE_DISABLED:				return "Disabled";
		case TESTSTATUSCODE_TERMINATED:				return "Terminated";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}